

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_clip_polyline.cpp
# Opt level: O0

void __thiscall agg::vpgen_clip_polyline::line_to(vpgen_clip_polyline *this,double x,double y)

{
  uint uVar1;
  uint uVar2;
  double dStack_30;
  uint flags;
  double y2;
  double x2;
  double y_local;
  double x_local;
  vpgen_clip_polyline *this_local;
  
  dStack_30 = y;
  y2 = x;
  x2 = y;
  y_local = x;
  x_local = (double)this;
  uVar2 = clip_line_segment<double>
                    ((double *)(this + 0x20),(double *)(this + 0x28),&y2,&stack0xffffffffffffffd0,
                     (rect_base<double> *)this);
  *(undefined4 *)(this + 0x5c) = 0;
  *(undefined4 *)(this + 0x58) = 0;
  if ((uVar2 & 4) == 0) {
    if (((uVar2 & 1) != 0) || (((byte)this[0x60] & 1) != 0)) {
      *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x20);
      *(undefined8 *)(this + 0x40) = *(undefined8 *)(this + 0x28);
      *(undefined4 *)(this + 0x50) = 1;
      *(undefined4 *)(this + 0x58) = 1;
    }
    *(double *)(this + (ulong)*(uint *)(this + 0x58) * 8 + 0x30) = y2;
    *(double *)(this + (ulong)*(uint *)(this + 0x58) * 8 + 0x40) = dStack_30;
    uVar1 = *(uint *)(this + 0x58);
    *(uint *)(this + 0x58) = uVar1 + 1;
    *(undefined4 *)(this + (ulong)uVar1 * 4 + 0x50) = 2;
    this[0x60] = (vpgen_clip_polyline)((uVar2 & 2) != 0);
  }
  *(double *)(this + 0x20) = y_local;
  *(double *)(this + 0x28) = x2;
  return;
}

Assistant:

void vpgen_clip_polyline::line_to(double x, double y)
    {
        double x2 = x;
        double y2 = y;
        unsigned flags = clip_line_segment(&m_x1, &m_y1, &x2, &y2, m_clip_box);

        m_vertex = 0;
        m_num_vertices = 0;
        if((flags & 4) == 0)
        {
            if((flags & 1) != 0 || m_move_to)
            {
                m_x[0] = m_x1;
                m_y[0] = m_y1;
                m_cmd[0] = path_cmd_move_to;
                m_num_vertices = 1;
            }
            m_x[m_num_vertices] = x2;
            m_y[m_num_vertices] = y2;
            m_cmd[m_num_vertices++] = path_cmd_line_to;
            m_move_to = (flags & 2) != 0;
        }
        m_x1 = x;
        m_y1 = y;
    }